

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void vpermpd(PDISASM pMyDisasm)

{
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      if ((((pMyDisasm->Reserved_).EVEX.state == '\x01') &&
          ((pMyDisasm->Reserved_).EVEX.W == '\x01')) ||
         (((pMyDisasm->Reserved_).EVEX.state != '\x01' && ((pMyDisasm->Reserved_).REX.W_ == '\x01'))
         )) {
        verifyVEXvvvv(pMyDisasm);
        if ((pMyDisasm->Reserved_).VEX.L == '\0') {
          (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
        }
        if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
          (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
        }
        strcpy((pMyDisasm->Instruction).Mnemonic,"vpermpd");
        vex_GxEx(pMyDisasm);
        getImmediat8(&pMyDisasm->Operand3,pMyDisasm);
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
  return;
}

Assistant:

void __bea_callspec__ vpermpd(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (
        ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 1)) ||
        ((GV.EVEX.state != InUsePrefix) && (GV.REX.W_ == 1))) {
          verifyVEXvvvv(pMyDisasm);
          if (GV.VEX.L == 0) GV.ERROR_OPCODE = UD_;
          if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpermpd");
          #endif
          vex_GxEx(pMyDisasm);
          getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
        }
        else {
          failDecode(pMyDisasm);
        }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}